

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  long lVar1;
  ContentCompression **ppCVar2;
  ContentEncryption **ppCVar3;
  ContentEncryption *encryption;
  unsigned_long_long uVar4;
  ContentEncoding *pCVar5;
  longlong lVar6;
  ulong uVar7;
  long stop;
  longlong lVar8;
  longlong pos;
  longlong size_1;
  ContentEncoding *local_50;
  ulong local_48;
  ulong local_40;
  longlong id;
  
  local_50 = this;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x106c,
                  "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                 );
  }
  stop = size + start;
  local_48 = 0;
  local_40 = 0;
  pos = start;
  while (pos < stop) {
    lVar1 = ParseElementHeader(pReader,&pos,stop,&id,&size_1);
    if (lVar1 < 0) {
      return lVar1;
    }
    if (id == 0x5035) {
      if (0x7ffffffe < (long)local_48) {
        return -1;
      }
      local_48 = local_48 + 1;
    }
    else if (id == 0x5034) {
      if (0x7ffffffe < (long)local_40) {
        return -1;
      }
      local_40 = local_40 + 1;
    }
    pos = pos + size_1;
    if (stop < pos) {
      return -2;
    }
  }
  if ((long)local_40 < 1 && (long)local_48 < 1) {
    return -1;
  }
  if (0 < (long)local_40) {
    uVar7 = local_40 * 8;
    if (0x1fffffffffffffff < local_40) {
      uVar7 = 0xffffffffffffffff;
    }
    ppCVar2 = (ContentCompression **)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    local_50->compression_entries_ = ppCVar2;
    if (ppCVar2 == (ContentCompression **)0x0) {
      return -1;
    }
    local_50->compression_entries_end_ = ppCVar2;
  }
  pCVar5 = local_50;
  lVar1 = start;
  if (0 < (long)local_48) {
    uVar7 = local_48 * 8;
    if (0x1fffffffffffffff < local_48) {
      uVar7 = 0xffffffffffffffff;
    }
    ppCVar3 = (ContentEncryption **)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    pCVar5 = local_50;
    local_50->encryption_entries_ = ppCVar3;
    if (ppCVar3 == (ContentEncryption **)0x0) {
      if (local_50->compression_entries_ != (ContentCompression **)0x0) {
        operator_delete__(local_50->compression_entries_);
      }
      pCVar5->compression_entries_ = (ContentCompression **)0x0;
      return -1;
    }
    local_50->encryption_entries_end_ = ppCVar3;
    lVar1 = start;
  }
  do {
    pos = lVar1;
    if (stop <= pos) {
      return (ulong)(pos == stop) * 2 + -2;
    }
    lVar1 = ParseElementHeader(pReader,&pos,stop,&id,&size_1);
    lVar6 = size_1;
    lVar8 = pos;
    if (lVar1 < 0) {
      return lVar1;
    }
    switch(id) {
    case 0x5031:
      uVar4 = UnserializeUInt(pReader,pos,size_1);
      pCVar5->encoding_order_ = uVar4;
      break;
    case 0x5032:
      uVar4 = UnserializeUInt(pReader,pos,size_1);
      pCVar5->encoding_scope_ = uVar4;
      if (uVar4 == 0) {
        return -1;
      }
      break;
    case 0x5033:
      uVar4 = UnserializeUInt(pReader,pos,size_1);
      pCVar5->encoding_type_ = uVar4;
      break;
    case 0x5034:
      pCVar5 = (ContentEncoding *)0x18;
      encryption = (ContentEncryption *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      lVar6 = size_1;
      lVar8 = pos;
      if (encryption == (ContentEncryption *)0x0) {
        return -1;
      }
      encryption->key_id_len = 0;
      encryption->algo = 0;
      encryption->key_id = (uchar *)0x0;
      lVar1 = ParseCompressionEntry(pCVar5,pos,size_1,pReader,(ContentCompression *)encryption);
      if (lVar1 != 0) {
        ContentCompression::~ContentCompression((ContentCompression *)encryption);
LAB_0011507a:
        operator_delete(encryption);
        return lVar1;
      }
      if ((long)local_40 < 1) {
        __assert_fail("compression_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10bc,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar3 = (ContentEncryption **)local_50->compression_entries_end_;
      local_50->compression_entries_end_ = (ContentCompression **)(ppCVar3 + 1);
      goto LAB_00114fde;
    case 0x5035:
      pCVar5 = (ContentEncoding *)0x50;
      encryption = (ContentEncryption *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      lVar6 = size_1;
      lVar8 = pos;
      if (encryption == (ContentEncryption *)0x0) {
        return -1;
      }
      encryption->sig_key_id_len = 0;
      encryption->sig_algo = 0;
      encryption->signature_len = 0;
      encryption->sig_key_id = (uchar *)0x0;
      encryption->key_id_len = 0;
      encryption->signature = (uchar *)0x0;
      encryption->sig_hash_algo = 0;
      encryption->algo = 0;
      encryption->key_id = (uchar *)0x0;
      (encryption->aes_settings).cipher_mode = 1;
      lVar1 = ParseEncryptionEntry(pCVar5,pos,size_1,pReader,encryption);
      if (lVar1 != 0) {
        ContentEncryption::~ContentEncryption(encryption);
        goto LAB_0011507a;
      }
      if ((long)local_48 < 1) {
        __assert_fail("encryption_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10c9,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar3 = local_50->encryption_entries_end_;
      local_50->encryption_entries_end_ = ppCVar3 + 1;
LAB_00114fde:
      *ppCVar3 = encryption;
      pCVar5 = local_50;
    }
    lVar1 = lVar8 + lVar6;
    if (stop < lVar8 + lVar6) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  long long compression_count = 0;
  long long encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression) {
      ++compression_count;
      if (compression_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    if (id == libwebm::kMkvContentEncryption) {
      ++encryption_count;
      if (encryption_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ = new (std::nothrow)
        ContentCompression*[static_cast<size_t>(compression_count)];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ = new (std::nothrow)
        ContentEncryption*[static_cast<size_t>(encryption_count)];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}